

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegenerator.cpp
# Opt level: O0

size_t __thiscall
stackjit::CodeGenerator::generateCompileCall
          (CodeGenerator *this,Amd64Assembler *assembler,ManagedFunction *function,
          FunctionDefinition *funcToCall)

{
  size_t startIndex;
  ManagedFunction *pMVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar2;
  size_type sVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  IntRegister local_70;
  IntRegister local_6b;
  IntRegister local_68;
  IntRegister local_63;
  IntRegister local_60;
  IntRegister local_5b;
  IntRegister local_58;
  IntRegister local_53;
  IntRegister local_50;
  IntRegister local_4b;
  IntRegister local_48;
  IntRegister local_43;
  IntRegister local_40;
  IntRegister local_3b;
  size_t local_38;
  size_t checkEndIndex;
  size_t callIndex;
  FunctionDefinition *funcToCall_local;
  ManagedFunction *function_local;
  Amd64Assembler *assembler_local;
  CodeGenerator *this_local;
  
  callIndex = (size_t)funcToCall;
  funcToCall_local = (FunctionDefinition *)function;
  function_local = (ManagedFunction *)assembler;
  assembler_local = (Amd64Assembler *)this;
  IntRegister::IntRegister(&local_3b,DI);
  local_40.mExtendedRegister = local_3b.mExtendedRegister;
  local_40.mIsBase = local_3b.mIsBase;
  local_40.mBaseRegister = local_3b.mBaseRegister;
  Amd64Assembler::moveLong(assembler,local_40,(int64_t)funcToCall_local);
  pMVar1 = function_local;
  IntRegister::IntRegister(&local_43,SI);
  local_48.mExtendedRegister = local_43.mExtendedRegister;
  local_48.mIsBase = local_43.mIsBase;
  local_48.mBaseRegister = local_43.mBaseRegister;
  Amd64Assembler::moveInt((Amd64Assembler *)pMVar1,local_48,0);
  pvVar2 = Amd64Assembler::data((Amd64Assembler *)function_local);
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pvVar2);
  pMVar1 = function_local;
  checkEndIndex = sVar3 - 4;
  IntRegister::IntRegister(&local_4b,DX);
  pvVar2 = Amd64Assembler::data((Amd64Assembler *)function_local);
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pvVar2);
  local_50.mExtendedRegister = local_4b.mExtendedRegister;
  local_50.mIsBase = local_4b.mIsBase;
  local_50.mBaseRegister = local_4b.mBaseRegister;
  Amd64Assembler::moveInt((Amd64Assembler *)pMVar1,local_50,(int32_t)sVar3);
  pMVar1 = function_local;
  IntRegister::IntRegister(&local_53,CX);
  local_58.mExtendedRegister = local_53.mExtendedRegister;
  local_58.mIsBase = local_53.mIsBase;
  local_58.mBaseRegister = local_53.mBaseRegister;
  Amd64Assembler::moveInt((Amd64Assembler *)pMVar1,local_58,0);
  pvVar2 = Amd64Assembler::data((Amd64Assembler *)function_local);
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pvVar2);
  pMVar1 = function_local;
  local_38 = sVar3 - 4;
  IntRegister::IntRegister(&local_5b,R8);
  local_60.mExtendedRegister = local_5b.mExtendedRegister;
  local_60.mIsBase = local_5b.mIsBase;
  local_60.mBaseRegister = local_5b.mBaseRegister;
  Amd64Assembler::moveLong((Amd64Assembler *)pMVar1,local_60,callIndex);
  pMVar1 = function_local;
  IntRegister::IntRegister(&local_63,AX);
  local_68.mExtendedRegister = local_63.mExtendedRegister;
  local_68.mIsBase = local_63.mIsBase;
  local_68.mBaseRegister = local_63.mBaseRegister;
  Amd64Assembler::moveLong((Amd64Assembler *)pMVar1,local_68,0x2490b0);
  pMVar1 = function_local;
  IntRegister::IntRegister(&local_6b,AX);
  local_70.mExtendedRegister = local_6b.mExtendedRegister;
  local_70.mIsBase = local_6b.mIsBase;
  local_70.mBaseRegister = local_6b.mBaseRegister;
  Amd64Assembler::call((Amd64Assembler *)pMVar1,local_70);
  pvVar2 = Amd64Assembler::data((Amd64Assembler *)function_local);
  startIndex = local_38;
  this_00 = Amd64Assembler::data((Amd64Assembler *)function_local);
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(this_00);
  Helpers::setValue<int>(pvVar2,startIndex,(int)sVar3);
  return checkEndIndex;
}

Assistant:

std::size_t CodeGenerator::generateCompileCall(Amd64Assembler& assembler,
												   ManagedFunction& function,
												   const FunctionDefinition& funcToCall) {
		std::size_t callIndex;
		std::size_t checkEndIndex;

		assembler.moveLong(RegisterCallArguments::Arg0, (PtrValue)&function);  //The current function
		assembler.moveInt(RegisterCallArguments::Arg1, 0); //Offset of the call
		callIndex = assembler.data().size() - sizeof(int);
		assembler.moveInt(RegisterCallArguments::Arg2, (int)assembler.data().size()); //The offset for this check
		assembler.moveInt(RegisterCallArguments::Arg3, 0); //The end of the this check
		checkEndIndex = assembler.data().size() - sizeof(int);
		assembler.moveLong(RegisterCallArguments::Arg4,	(PtrValue)(&funcToCall)); //The function to compile

		assembler.moveLong(Registers::AX, (PtrValue)&Runtime::compileFunction);
		assembler.call(Registers::AX);

		Helpers::setValue(assembler.data(), checkEndIndex, (int)assembler.data().size());
		return callIndex;
	}